

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  int *piVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  unkbyte10 Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar15;
  undefined4 uVar16;
  short sVar17;
  short sVar18;
  int iVar19;
  int iVar20;
  parasail_result_t *ppVar21;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  long lVar22;
  int iVar23;
  ulong uVar24;
  char *pcVar25;
  int iVar26;
  uint uVar27;
  long lVar28;
  char *__format;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  uint uVar37;
  int16_t iVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  bool bVar42;
  undefined4 uVar43;
  undefined1 auVar46 [16];
  undefined4 uVar44;
  undefined4 uVar45;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined4 uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar60 [16];
  short sVar61;
  short sVar62;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  undefined1 auVar75 [16];
  ushort uVar76;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  uint local_1a0;
  int16_t *local_188;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  long local_108;
  undefined8 local_88;
  ulong uStack_80;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  short sVar50;
  short sVar54;
  short sVar63;
  short sVar66;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "_s2";
  }
  else {
    uVar41 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar25 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar25 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar25 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar25 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        uVar24 = (ulong)(uint)matrix->length;
LAB_0065f3d2:
        iVar23 = -open;
        iVar26 = matrix->min;
        iVar20 = -iVar26;
        if (iVar26 != iVar23 && SBORROW4(iVar26,iVar23) == iVar26 + open < 0) {
          iVar20 = open;
        }
        iVar19 = matrix->max;
        uVar29 = (uint)uVar24;
        ppVar21 = parasail_result_new_table1(uVar29,s2Len);
        if (ppVar21 != (parasail_result_t *)0x0) {
          ppVar21->flag = ppVar21->flag | 0x8221001;
          uVar31 = (ulong)(s2Len + 0xe);
          ptr = parasail_memalign_int16_t(0x10,uVar31);
          ptr_00 = parasail_memalign_int16_t(0x10,uVar31);
          ptr_01 = parasail_memalign_int16_t(0x10,uVar31);
          if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
            lVar28 = (long)(int)uVar29;
            if (matrix->type == 0) {
              local_188 = parasail_memalign_int16_t(0x10,(long)(int)(uVar29 + 7));
              uVar31 = 0;
              if (local_188 == (int16_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar35 = 0;
              if (0 < (int)uVar29) {
                uVar35 = uVar24;
              }
              for (; lVar22 = lVar28, uVar35 != uVar31; uVar31 = uVar31 + 1) {
                local_188[uVar31] = (int16_t)matrix->mapper[(byte)_s1[uVar31]];
              }
              for (; lVar22 < (int)(uVar29 + 7); lVar22 = lVar22 + 1) {
                local_188[lVar22] = 0;
              }
            }
            else {
              local_188 = (int16_t *)0x0;
            }
            auVar46 = ZEXT416(CONCAT22((short)((uint)iVar26 >> 0x10),0x7ffe - (short)iVar19));
            sVar18 = (short)gap;
            sVar17 = (short)iVar23;
            sVar63 = (short)open;
            uVar33 = s2Len + 7;
            local_1a0 = uVar29 - 1;
            iVar26 = s2Len + -1;
            uVar39 = iVar20 - 0x7fff;
            auVar58 = pshuflw(ZEXT416(uVar39),ZEXT416(uVar39),0);
            uVar57 = auVar58._0_4_;
            sVar61 = auVar58._0_2_;
            sVar62 = auVar58._2_2_;
            auVar46 = pshuflw(auVar46,auVar46,0);
            uVar43 = auVar46._0_4_;
            sVar67 = auVar46._0_2_;
            sVar69 = auVar46._2_2_;
            auVar46 = pshuflw(auVar46,ZEXT416((uint)open),0);
            uVar44 = auVar46._0_4_;
            auVar59._4_4_ = uVar44;
            auVar59._0_4_ = uVar44;
            auVar59._8_4_ = uVar44;
            auVar59._12_4_ = uVar44;
            auVar46 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar44 = auVar46._0_4_;
            auVar46 = pshuflw(auVar46,ZEXT416(uVar29),0);
            uVar45 = auVar46._0_4_;
            auVar51._4_4_ = uVar45;
            auVar51._0_4_ = uVar45;
            auVar51._8_4_ = uVar45;
            auVar51._12_4_ = uVar45;
            auVar58._8_4_ = 0xffffffff;
            auVar58._0_8_ = 0xffffffffffffffff;
            auVar58._12_4_ = 0xffffffff;
            auVar51 = paddsw(auVar51,auVar58);
            auVar46 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
            auVar86._0_4_ = auVar46._0_4_;
            auVar86._4_4_ = auVar86._0_4_;
            auVar86._8_4_ = auVar86._0_4_;
            auVar86._12_4_ = auVar86._0_4_;
            auVar58 = paddsw(auVar86,auVar58);
            auVar46._4_4_ = uVar44;
            auVar46._0_4_ = uVar44;
            auVar46._8_4_ = uVar44;
            auVar46._12_4_ = uVar44;
            auVar56._10_2_ = sVar17 + sVar18 * -2;
            auVar56._8_2_ = sVar18 * -3 - sVar63;
            auVar56._12_2_ = sVar17 - sVar18;
            auVar56._14_2_ = sVar17;
            auVar56._0_8_ =
                 (ulong)(uint)(gap * 0xfff9 - open) & 0xffffffff0000ffff |
                 (ulong)(ushort)(sVar18 * -6 - sVar63) << 0x10 |
                 (ulong)(ushort)(sVar18 * -5 - sVar63) << 0x20 |
                 (ulong)(ushort)(sVar17 + sVar18 * -4) << 0x30;
            auVar46 = psllw(auVar46,3);
            piVar1 = matrix->mapper;
            for (uVar24 = 0; uVar41 != uVar24; uVar24 = uVar24 + 1) {
              ptr[uVar24 + 7] = (int16_t)piVar1[(byte)_s2[uVar24]];
            }
            for (lVar22 = 0; uVar24 = uVar41, lVar22 != 7; lVar22 = lVar22 + 1) {
              ptr[lVar22] = 0;
            }
            for (; (int)uVar24 < (int)uVar33; uVar24 = uVar24 + 1) {
              ptr[uVar24 + 7] = 0;
            }
            for (uVar24 = 0; iVar38 = (int16_t)uVar39, uVar41 != uVar24; uVar24 = uVar24 + 1) {
              ptr_00[uVar24 + 7] = (int16_t)iVar23;
              iVar23 = iVar23 - gap;
              ptr_01[uVar24 + 7] = iVar38;
            }
            for (lVar22 = 0; uVar24 = uVar41, lVar22 != 7; lVar22 = lVar22 + 1) {
              ptr_00[lVar22] = iVar38;
              ptr_01[lVar22] = iVar38;
            }
            for (; (int)uVar24 < (int)uVar33; uVar24 = uVar24 + 1) {
              ptr_00[uVar24 + 7] = iVar38;
              ptr_01[uVar24 + 7] = iVar38;
            }
            ptr_00[6] = 0;
            Var12 = CONCAT28(sVar61,CONCAT26(sVar62,CONCAT24(sVar61,uVar57)));
            auVar11._10_2_ = sVar62;
            auVar11._0_10_ = Var12;
            auVar11._12_2_ = sVar61;
            auVar11._14_2_ = sVar62;
            local_108 = 0;
            if ((int)uVar33 < 1) {
              uVar33 = 0;
            }
            lVar22 = uVar41 * 4;
            auVar86 = pmovsxbw(in_XMM13,0x1020304050607);
            uVar24 = 0;
            auVar64._4_2_ = sVar61;
            auVar64._0_4_ = uVar57;
            auVar64._6_2_ = sVar62;
            auVar64._8_2_ = sVar61;
            auVar64._10_2_ = sVar62;
            auVar64._12_2_ = sVar61;
            auVar64._14_2_ = sVar62;
            auVar75._4_2_ = sVar61;
            auVar75._0_4_ = uVar57;
            auVar75._6_2_ = sVar62;
            auVar75._8_2_ = sVar61;
            auVar75._10_2_ = sVar62;
            auVar75._12_2_ = sVar61;
            auVar75._14_2_ = sVar62;
            uVar45 = uVar43;
            uVar15 = uVar43;
            uVar16 = uVar43;
            while( true ) {
              if (lVar28 <= (long)uVar24) break;
              if (matrix->type == 0) {
                uVar32 = (uint)local_188[uVar24 + 1];
                uVar37 = (uint)local_188[uVar24 + 2];
                uVar27 = (uint)local_188[uVar24 + 3];
                uVar34 = (uint)local_188[uVar24 + 4];
                uVar30 = (uint)local_188[uVar24 + 5];
                uVar36 = (uint)local_188[uVar24 + 6];
                uVar31 = (ulong)(uint)(int)local_188[uVar24];
                uVar29 = (int)local_188[uVar24 + 7];
              }
              else {
                uVar29 = (uint)uVar24;
                uVar32 = local_1a0;
                if ((long)(uVar24 | 1) < lVar28) {
                  uVar32 = uVar29 | 1;
                }
                uVar37 = uVar29 | 2;
                if (lVar28 <= (long)(uVar24 | 2)) {
                  uVar37 = local_1a0;
                }
                uVar27 = uVar29 | 3;
                if (lVar28 <= (long)(uVar24 | 3)) {
                  uVar27 = local_1a0;
                }
                uVar34 = uVar29 | 4;
                if (lVar28 <= (long)(uVar24 | 4)) {
                  uVar34 = local_1a0;
                }
                uVar30 = uVar29 | 5;
                if (lVar28 <= (long)(uVar24 | 5)) {
                  uVar30 = local_1a0;
                }
                uVar36 = uVar29 | 6;
                if (lVar28 <= (long)(uVar24 | 6)) {
                  uVar36 = local_1a0;
                }
                uVar31 = uVar24;
                uVar29 = uVar29 | 7;
                if (lVar28 <= (long)(uVar24 | 7)) {
                  uVar29 = local_1a0;
                }
              }
              local_110 = uVar24 | 1;
              local_118 = uVar24 | 2;
              local_120 = uVar24 | 6;
              local_128 = uVar24 | 3;
              local_130 = uVar24 | 4;
              local_138 = uVar24 | 5;
              uVar40 = uVar24 | 7;
              piVar1 = matrix->matrix;
              iVar20 = matrix->size;
              local_88 = (undefined8)((unkuint10)Var12 >> 0x10);
              uStack_80 = auVar11._8_8_ >> 0x10;
              auVar47._8_8_ = uStack_80 | (ulong)(ushort)ptr_00[6] << 0x30;
              auVar47._0_8_ = local_88;
              auVar78._8_8_ = uStack_80 | (ulong)(ushort)(sVar17 - (short)uVar24 * sVar18) << 0x30;
              auVar78._0_8_ = local_88;
              uVar24 = uVar24 + 8;
              ptr_00[6] = sVar17 - (short)uVar24 * sVar18;
              local_68 = auVar51._0_2_;
              sStack_66 = auVar51._2_2_;
              sStack_64 = auVar51._4_2_;
              sStack_62 = auVar51._6_2_;
              sStack_60 = auVar51._8_2_;
              sStack_5e = auVar51._10_2_;
              sStack_5c = auVar51._12_2_;
              sStack_5a = auVar51._14_2_;
              auVar87._0_2_ = -(ushort)(auVar86._0_2_ == local_68);
              auVar87._2_2_ = -(ushort)(auVar86._2_2_ == sStack_66);
              auVar87._4_2_ = -(ushort)(auVar86._4_2_ == sStack_64);
              auVar87._6_2_ = -(ushort)(auVar86._6_2_ == sStack_62);
              auVar87._8_2_ = -(ushort)(auVar86._8_2_ == sStack_60);
              auVar87._10_2_ = -(ushort)(auVar86._10_2_ == sStack_5e);
              auVar87._12_2_ = -(ushort)(auVar86._12_2_ == sStack_5c);
              auVar87._14_2_ = -(ushort)(auVar86._14_2_ == sStack_5a);
              auVar53._4_2_ = sVar61;
              auVar53._0_4_ = uVar57;
              auVar53._6_2_ = sVar62;
              auVar53._8_2_ = sVar61;
              auVar53._10_2_ = sVar62;
              auVar53._12_2_ = sVar61;
              auVar53._14_2_ = sVar62;
              auVar91._4_2_ = sVar61;
              auVar91._0_4_ = uVar57;
              auVar91._6_2_ = sVar62;
              auVar91._8_2_ = sVar61;
              auVar91._10_2_ = sVar62;
              auVar91._12_2_ = sVar61;
              auVar91._14_2_ = sVar62;
              in_XMM6 = pmovsxbw(in_XMM6,0xfffefdfcfbfaf9);
              uVar35 = 0;
              while( true ) {
                sVar74 = (short)((uint)uVar16 >> 0x10);
                sVar73 = (short)uVar16;
                sVar72 = (short)((uint)uVar15 >> 0x10);
                sVar71 = (short)uVar15;
                sVar70 = (short)((uint)uVar45 >> 0x10);
                sVar68 = (short)uVar45;
                sVar66 = (short)((uint)uVar43 >> 0x10);
                sVar63 = (short)uVar43;
                if (uVar33 == uVar35) break;
                auVar92._10_2_ = (short)piVar1[(long)(int)(uVar37 * iVar20) + (long)ptr[uVar35 + 5]]
                ;
                auVar92._8_2_ = (short)piVar1[(long)(int)(uVar27 * iVar20) + (long)ptr[uVar35 + 4]];
                auVar92._12_2_ = (short)piVar1[(long)(int)(uVar32 * iVar20) + (long)ptr[uVar35 + 6]]
                ;
                auVar92._14_2_ = (short)piVar1[(long)((int)uVar31 * iVar20) + (long)ptr[uVar35 + 7]]
                ;
                auVar92._0_8_ =
                     (ulong)(uint)piVar1[(long)(int)(uVar29 * iVar20) + (long)ptr[uVar35]] &
                     0xffffffff0000ffff |
                     (ulong)*(ushort *)
                             (piVar1 + (long)(int)(uVar36 * iVar20) + (long)ptr[uVar35 + 1]) << 0x10
                     | (ulong)*(ushort *)
                               (piVar1 + (long)(int)(uVar30 * iVar20) + (long)ptr[uVar35 + 2]) <<
                       0x20 | (ulong)*(ushort *)
                                      (piVar1 + (long)(int)(uVar34 * iVar20) + (long)ptr[uVar35 + 3]
                                      ) << 0x30;
                auVar60._0_8_ = auVar78._2_8_;
                auVar60._8_8_ = auVar78._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar35 + 7] << 0x30;
                auVar88._0_8_ = auVar91._2_8_;
                auVar88._8_8_ = auVar91._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar35 + 7] << 0x30;
                auVar55 = psubsw(auVar60,auVar59);
                auVar9._4_4_ = uVar44;
                auVar9._0_4_ = uVar44;
                auVar9._8_4_ = uVar44;
                auVar9._12_4_ = uVar44;
                auVar89 = psubsw(auVar88,auVar9);
                sVar3 = auVar55._0_2_;
                sVar50 = auVar89._0_2_;
                auVar90._0_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar55._2_2_;
                sVar50 = auVar89._2_2_;
                auVar90._2_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar55._4_2_;
                sVar50 = auVar89._4_2_;
                auVar90._4_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar55._6_2_;
                sVar50 = auVar89._6_2_;
                auVar90._6_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar55._8_2_;
                sVar50 = auVar89._8_2_;
                auVar90._8_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar55._10_2_;
                sVar50 = auVar89._10_2_;
                auVar90._10_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar55._12_2_;
                sVar50 = auVar89._12_2_;
                sVar54 = auVar89._14_2_;
                auVar90._12_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar55._14_2_;
                auVar90._14_2_ =
                     (ushort)(sVar54 < sVar3) * sVar3 | (ushort)(sVar54 >= sVar3) * sVar54;
                auVar89 = psubsw(auVar78,auVar59);
                auVar10._4_4_ = uVar44;
                auVar10._0_4_ = uVar44;
                auVar10._8_4_ = uVar44;
                auVar10._12_4_ = uVar44;
                auVar55 = psubsw(auVar53,auVar10);
                sVar3 = auVar89._0_2_;
                sVar50 = auVar55._0_2_;
                auVar52._0_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar89._2_2_;
                sVar50 = auVar55._2_2_;
                auVar52._2_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar89._4_2_;
                sVar50 = auVar55._4_2_;
                auVar52._4_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar89._6_2_;
                sVar50 = auVar55._6_2_;
                auVar52._6_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar89._8_2_;
                sVar50 = auVar55._8_2_;
                auVar52._8_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar89._10_2_;
                sVar50 = auVar55._10_2_;
                auVar52._10_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar89._12_2_;
                sVar50 = auVar55._12_2_;
                sVar54 = auVar55._14_2_;
                auVar52._12_2_ =
                     (ushort)(sVar50 < sVar3) * sVar3 | (ushort)(sVar50 >= sVar3) * sVar50;
                sVar3 = auVar89._14_2_;
                auVar52._14_2_ =
                     (ushort)(sVar54 < sVar3) * sVar3 | (ushort)(sVar54 >= sVar3) * sVar54;
                auVar55 = paddsw(auVar47,auVar92);
                uVar76 = ((short)auVar52._0_2_ < (short)auVar90._0_2_) * auVar90._0_2_ |
                         ((short)auVar52._0_2_ >= (short)auVar90._0_2_) * auVar52._0_2_;
                uVar79 = ((short)auVar52._2_2_ < (short)auVar90._2_2_) * auVar90._2_2_ |
                         ((short)auVar52._2_2_ >= (short)auVar90._2_2_) * auVar52._2_2_;
                uVar80 = ((short)auVar52._4_2_ < (short)auVar90._4_2_) * auVar90._4_2_ |
                         ((short)auVar52._4_2_ >= (short)auVar90._4_2_) * auVar52._4_2_;
                uVar81 = ((short)auVar52._6_2_ < (short)auVar90._6_2_) * auVar90._6_2_ |
                         ((short)auVar52._6_2_ >= (short)auVar90._6_2_) * auVar52._6_2_;
                uVar82 = ((short)auVar52._8_2_ < (short)auVar90._8_2_) * auVar90._8_2_ |
                         ((short)auVar52._8_2_ >= (short)auVar90._8_2_) * auVar52._8_2_;
                uVar83 = ((short)auVar52._10_2_ < (short)auVar90._10_2_) * auVar90._10_2_ |
                         ((short)auVar52._10_2_ >= (short)auVar90._10_2_) * auVar52._10_2_;
                uVar84 = ((short)auVar52._12_2_ < (short)auVar90._12_2_) * auVar90._12_2_ |
                         ((short)auVar52._12_2_ >= (short)auVar90._12_2_) * auVar52._12_2_;
                uVar85 = ((short)auVar52._14_2_ < (short)auVar90._14_2_) * auVar90._14_2_ |
                         ((short)auVar52._14_2_ >= (short)auVar90._14_2_) * auVar52._14_2_;
                sVar3 = auVar55._0_2_;
                auVar77._0_2_ =
                     (ushort)((short)uVar76 < sVar3) * sVar3 | ((short)uVar76 >= sVar3) * uVar76;
                sVar3 = auVar55._2_2_;
                auVar77._2_2_ =
                     (ushort)((short)uVar79 < sVar3) * sVar3 | ((short)uVar79 >= sVar3) * uVar79;
                sVar3 = auVar55._4_2_;
                auVar77._4_2_ =
                     (ushort)((short)uVar80 < sVar3) * sVar3 | ((short)uVar80 >= sVar3) * uVar80;
                sVar3 = auVar55._6_2_;
                auVar77._6_2_ =
                     (ushort)((short)uVar81 < sVar3) * sVar3 | ((short)uVar81 >= sVar3) * uVar81;
                sVar3 = auVar55._8_2_;
                auVar77._8_2_ =
                     (ushort)((short)uVar82 < sVar3) * sVar3 | ((short)uVar82 >= sVar3) * uVar82;
                sVar3 = auVar55._10_2_;
                auVar77._10_2_ =
                     (ushort)((short)uVar83 < sVar3) * sVar3 | ((short)uVar83 >= sVar3) * uVar83;
                sVar3 = auVar55._12_2_;
                auVar77._12_2_ =
                     (ushort)((short)uVar84 < sVar3) * sVar3 | ((short)uVar84 >= sVar3) * uVar84;
                sVar3 = auVar55._14_2_;
                auVar77._14_2_ =
                     (ushort)((short)uVar85 < sVar3) * sVar3 | ((short)uVar85 >= sVar3) * uVar85;
                auVar48._0_2_ = -(ushort)(in_XMM6._0_2_ == -1);
                auVar48._2_2_ = -(ushort)(in_XMM6._2_2_ == -1);
                auVar48._4_2_ = -(ushort)(in_XMM6._4_2_ == -1);
                auVar48._6_2_ = -(ushort)(in_XMM6._6_2_ == -1);
                auVar48._8_2_ = -(ushort)(in_XMM6._8_2_ == -1);
                auVar48._10_2_ = -(ushort)(in_XMM6._10_2_ == -1);
                auVar48._12_2_ = -(ushort)(in_XMM6._12_2_ == -1);
                auVar48._14_2_ = -(ushort)(in_XMM6._14_2_ == -1);
                auVar78 = pblendvb(auVar77,auVar56,auVar48);
                auVar13._4_2_ = sVar61;
                auVar13._0_4_ = uVar57;
                auVar13._6_2_ = sVar62;
                auVar13._8_2_ = sVar61;
                auVar13._10_2_ = sVar62;
                auVar13._12_2_ = sVar61;
                auVar13._14_2_ = sVar62;
                auVar91 = pblendvb(auVar90,auVar13,auVar48);
                auVar14._4_2_ = sVar61;
                auVar14._0_4_ = uVar57;
                auVar14._6_2_ = sVar62;
                auVar14._8_2_ = sVar61;
                auVar14._10_2_ = sVar62;
                auVar14._12_2_ = sVar61;
                auVar14._14_2_ = sVar62;
                auVar53 = pblendvb(auVar52,auVar14,auVar48);
                sVar3 = auVar78._0_2_;
                sVar50 = auVar78._2_2_;
                sVar54 = auVar78._4_2_;
                sVar4 = auVar78._6_2_;
                sVar5 = auVar78._8_2_;
                sVar6 = auVar78._10_2_;
                sVar7 = auVar78._12_2_;
                sVar8 = auVar78._14_2_;
                auVar65 = auVar64;
                if (7 < uVar35) {
                  uVar43 = CONCAT22((ushort)(sVar50 < sVar66) * sVar50 |
                                    (ushort)(sVar50 >= sVar66) * sVar66,
                                    (ushort)(sVar3 < sVar63) * sVar3 |
                                    (ushort)(sVar3 >= sVar63) * sVar63);
                  uVar45 = CONCAT22((ushort)(sVar4 < sVar70) * sVar4 |
                                    (ushort)(sVar4 >= sVar70) * sVar70,
                                    (ushort)(sVar54 < sVar68) * sVar54 |
                                    (ushort)(sVar54 >= sVar68) * sVar68);
                  uVar15 = CONCAT22((ushort)(sVar6 < sVar72) * sVar6 |
                                    (ushort)(sVar6 >= sVar72) * sVar72,
                                    (ushort)(sVar5 < sVar71) * sVar5 |
                                    (ushort)(sVar5 >= sVar71) * sVar71);
                  uVar16 = CONCAT22((ushort)(sVar8 < sVar74) * sVar8 |
                                    (ushort)(sVar8 >= sVar74) * sVar74,
                                    (ushort)(sVar7 < sVar73) * sVar7 |
                                    (ushort)(sVar7 >= sVar73) * sVar73);
                  sVar63 = auVar64._0_2_;
                  auVar65._0_2_ =
                       (ushort)(sVar63 < sVar3) * sVar3 | (ushort)(sVar63 >= sVar3) * sVar63;
                  sVar63 = auVar64._2_2_;
                  auVar65._2_2_ =
                       (ushort)(sVar63 < sVar50) * sVar50 | (ushort)(sVar63 >= sVar50) * sVar63;
                  sVar63 = auVar64._4_2_;
                  auVar65._4_2_ =
                       (ushort)(sVar63 < sVar54) * sVar54 | (ushort)(sVar63 >= sVar54) * sVar63;
                  sVar63 = auVar64._6_2_;
                  auVar65._6_2_ =
                       (ushort)(sVar63 < sVar4) * sVar4 | (ushort)(sVar63 >= sVar4) * sVar63;
                  sVar63 = auVar64._8_2_;
                  auVar65._8_2_ =
                       (ushort)(sVar63 < sVar5) * sVar5 | (ushort)(sVar63 >= sVar5) * sVar63;
                  sVar63 = auVar64._10_2_;
                  auVar65._10_2_ =
                       (ushort)(sVar63 < sVar6) * sVar6 | (ushort)(sVar63 >= sVar6) * sVar63;
                  sVar63 = auVar64._12_2_;
                  sVar66 = auVar64._14_2_;
                  auVar65._12_2_ =
                       (ushort)(sVar63 < sVar7) * sVar7 | (ushort)(sVar63 >= sVar7) * sVar63;
                  auVar65._14_2_ =
                       (ushort)(sVar66 < sVar8) * sVar8 | (ushort)(sVar66 >= sVar8) * sVar66;
                }
                piVar2 = ((ppVar21->field_4).rowcols)->score_row;
                if (uVar35 < uVar41) {
                  *(int *)((long)piVar2 + uVar35 * 4 + local_108) = (int)sVar8;
                }
                if (uVar35 - 1 < uVar41 && (long)local_110 < lVar28) {
                  *(int *)((long)piVar2 + uVar35 * 4 + lVar22 * local_110 + -4) = (int)sVar7;
                }
                if (((long)local_118 < lVar28) && ((long)(uVar35 - 2) < (long)uVar41 && 1 < uVar35))
                {
                  *(int *)((long)piVar2 + uVar35 * 4 + lVar22 * local_118 + -8) = (int)sVar6;
                }
                if (((long)local_128 < lVar28) && ((long)(uVar35 - 3) < (long)uVar41 && 2 < uVar35))
                {
                  *(int *)((long)piVar2 + uVar35 * 4 + lVar22 * local_128 + -0xc) = (int)sVar5;
                }
                if (((long)local_130 < lVar28) && ((long)(uVar35 - 4) < (long)uVar41 && 3 < uVar35))
                {
                  *(int *)((long)piVar2 + uVar35 * 4 + lVar22 * local_130 + -0x10) = (int)sVar4;
                }
                if (((long)local_138 < lVar28) && ((long)(uVar35 - 5) < (long)uVar41 && 4 < uVar35))
                {
                  *(int *)((long)piVar2 + uVar35 * 4 + lVar22 * local_138 + -0x14) = (int)sVar54;
                }
                if (((long)local_120 < lVar28) && ((long)(uVar35 - 6) < (long)uVar41 && 5 < uVar35))
                {
                  *(int *)((long)piVar2 + uVar35 * 4 + lVar22 * local_120 + -0x18) = (int)sVar50;
                }
                if (6 < uVar35 && (long)uVar40 < lVar28) {
                  *(int *)((long)piVar2 + uVar35 * 4 + lVar22 * uVar40 + -0x1c) = (int)sVar3;
                }
                ptr_00[uVar35] = sVar3;
                ptr_01[uVar35] = auVar91._0_2_;
                local_48 = auVar58._0_2_;
                sStack_46 = auVar58._2_2_;
                sStack_44 = auVar58._4_2_;
                sStack_42 = auVar58._6_2_;
                sStack_40 = auVar58._8_2_;
                sStack_3e = auVar58._10_2_;
                sStack_3c = auVar58._12_2_;
                sStack_3a = auVar58._14_2_;
                auVar49._0_2_ = -(ushort)(in_XMM6._0_2_ == local_48);
                auVar49._2_2_ = -(ushort)(in_XMM6._2_2_ == sStack_46);
                auVar49._4_2_ = -(ushort)(in_XMM6._4_2_ == sStack_44);
                auVar49._6_2_ = -(ushort)(in_XMM6._6_2_ == sStack_42);
                auVar49._8_2_ = -(ushort)(in_XMM6._8_2_ == sStack_40);
                auVar49._10_2_ = -(ushort)(in_XMM6._10_2_ == sStack_3e);
                auVar49._12_2_ = -(ushort)(in_XMM6._12_2_ == sStack_3c);
                auVar49._14_2_ = -(ushort)(in_XMM6._14_2_ == sStack_3a);
                auVar75 = pblendvb(auVar75,auVar78,auVar49 & auVar87);
                in_XMM6 = paddsw(in_XMM6,_DAT_008a1ba0);
                uVar35 = uVar35 + 1;
                auVar47 = auVar60;
                auVar64 = auVar65;
              }
              auVar86 = paddsw(auVar86,_DAT_008a1bb0);
              auVar56 = psubsw(auVar56,auVar46);
              local_108 = local_108 + uVar41 * 0x20;
            }
            iVar20 = 8;
            while( true ) {
              sVar63 = (short)uVar39;
              bVar42 = iVar20 == 0;
              iVar20 = iVar20 + -1;
              if (bVar42) break;
              uVar41 = auVar75._0_8_;
              lVar28 = auVar75._8_8_;
              uVar29 = (uint)auVar75._14_2_;
              if ((short)auVar75._14_2_ <= sVar63) {
                uVar29 = uVar39;
              }
              uVar39 = uVar29;
              auVar75._0_8_ = uVar41 << 0x10;
              auVar75._8_8_ = lVar28 << 0x10 | uVar41 >> 0x30;
            }
            auVar89._0_2_ = -(ushort)(sVar67 < auVar64._0_2_);
            auVar89._2_2_ = -(ushort)(sVar69 < auVar64._2_2_);
            auVar89._4_2_ = -(ushort)(sVar67 < auVar64._4_2_);
            auVar89._6_2_ = -(ushort)(sVar69 < auVar64._6_2_);
            auVar89._8_2_ = -(ushort)(sVar67 < auVar64._8_2_);
            auVar89._10_2_ = -(ushort)(sVar69 < auVar64._10_2_);
            auVar89._12_2_ = -(ushort)(sVar67 < auVar64._12_2_);
            auVar89._14_2_ = -(ushort)(sVar69 < auVar64._14_2_);
            auVar55._2_2_ = -(ushort)((short)((uint)uVar43 >> 0x10) < sVar62);
            auVar55._0_2_ = -(ushort)((short)uVar43 < sVar61);
            auVar55._4_2_ = -(ushort)((short)uVar45 < sVar61);
            auVar55._6_2_ = -(ushort)((short)((uint)uVar45 >> 0x10) < sVar62);
            auVar55._8_2_ = -(ushort)((short)uVar15 < sVar61);
            auVar55._10_2_ = -(ushort)((short)((uint)uVar15 >> 0x10) < sVar62);
            auVar55._12_2_ = -(ushort)((short)uVar16 < sVar61);
            auVar55._14_2_ = -(ushort)((short)((uint)uVar16 >> 0x10) < sVar62);
            auVar89 = auVar89 | auVar55;
            if ((((((((((((((((auVar89 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar89 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar89 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar89 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar89 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar89 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar89 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar89 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar89 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar89 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar89 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar89 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar89 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar89 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar89 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar89[0xf] < '\0') {
              *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
              sVar63 = 0;
              iVar26 = 0;
              local_1a0 = 0;
            }
            ppVar21->score = (int)sVar63;
            ppVar21->end_query = local_1a0;
            ppVar21->end_ref = iVar26;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_188);
              return ppVar21;
            }
            return ppVar21;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar25 = "_s1";
      }
      else {
        uVar24 = (ulong)(uint)_s1Len;
        if (0 < _s1Len) goto LAB_0065f3d2;
        __format = "%s: %s must be > 0\n";
        pcVar25 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_diag_sse41_128_16",pcVar25);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMax = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi16(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm_extract_epi16(vMax, 7);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 2);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}